

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatString.hpp
# Opt level: O0

string * __thiscall
Diligent::
FormatString<char[16],char_const*,char[7],char_const*,char[15],char[34],unsigned_int,char[31]>
          (string *__return_storage_ptr__,Diligent *this,char (*Args) [16],char **Args_1,
          char (*Args_2) [7],char **Args_3,char (*Args_4) [15],char (*Args_5) [34],uint *Args_6,
          char (*Args_7) [31])

{
  stringstream local_1c8 [8];
  stringstream ss;
  char (*Args_local_4) [15];
  char **Args_local_3;
  char (*Args_local_2) [7];
  char **Args_local_1;
  char (*Args_local) [16];
  
  std::__cxx11::stringstream::stringstream(local_1c8);
  FormatStrSS<std::__cxx11::stringstream,char[16],char_const*,char[7],char_const*,char[15],char[34],unsigned_int,char[31]>
            ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1c8,
             (char (*) [16])this,(char **)Args,(char (*) [7])Args_1,(char **)Args_2,
             (char (*) [15])Args_3,(char (*) [34])Args_4,(uint *)Args_5,(char (*) [31])Args_6);
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1c8);
  return __return_storage_ptr__;
}

Assistant:

std::string FormatString(const RestArgsType&... Args)
{
    std::stringstream ss;
    FormatStrSS(ss, Args...);
    return ss.str();
}